

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

void hash_commitment(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong databitlen;
  uint8_t tmp [64];
  hash_context ctx;
  BitSequence local_159 [73];
  Keccak_HashInstance local_110;
  
  bVar1 = pp->digest_size;
  local_159[1] = 4;
  if (bVar1 == 0x20) {
    uVar3 = 0x540;
    uVar2 = 0x100;
  }
  else {
    uVar3 = 0x440;
    uVar2 = 0x200;
  }
  Keccak_HashInitialize(&local_110,uVar3,uVar2,0,'\x1f');
  Keccak_HashUpdate(&local_110,local_159 + 1,8);
  Keccak_HashUpdate(&local_110,prf_round->seeds[vidx],(ulong)pp->seed_size << 3);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  databitlen = (ulong)((uint)bVar1 * 8);
  Keccak_HashSqueeze(&local_110,local_159 + 1,databitlen);
  local_159[0] = '\0';
  if (bVar1 == 0x20) {
    uVar3 = 0x540;
    uVar2 = 0x100;
  }
  else {
    uVar3 = 0x440;
    uVar2 = 0x200;
  }
  Keccak_HashInitialize(&local_110,uVar3,uVar2,0,'\x1f');
  Keccak_HashUpdate(&local_110,local_159,8);
  Keccak_HashUpdate(&local_110,local_159 + 1,databitlen);
  Keccak_HashUpdate(&local_110,prf_round->input_shares[vidx],(ulong)pp->input_output_size << 3);
  Keccak_HashUpdate(&local_110,prf_round->communicated_bits[vidx],(ulong)pp->view_size << 3);
  Keccak_HashUpdate(&local_110,prf_round->output_shares[vidx],(ulong)pp->input_output_size << 3);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,prf_round->commitments[vidx],databitlen);
  return;
}

Assistant:

static void hash_commitment(const picnic_instance_t* pp, proof_round_t* prf_round,
                            const unsigned int vidx) {
  const unsigned int hashlen = pp->digest_size;

  hash_context ctx;
  // hash the seed
  hash_init_prefix(&ctx, hashlen, HASH_PREFIX_4);
  hash_update(&ctx, prf_round->seeds[vidx], pp->seed_size);
  hash_final(&ctx);
  uint8_t tmp[MAX_DIGEST_SIZE];
  hash_squeeze(&ctx, tmp, hashlen);
  hash_clear(&ctx);

  // compute H_0(H_4(seed), view)
  hash_init_prefix(&ctx, hashlen, HASH_PREFIX_0);
  hash_update(&ctx, tmp, hashlen);
  // hash input share
  hash_update(&ctx, prf_round->input_shares[vidx], pp->input_output_size);
  // hash communicated bits
  hash_update(&ctx, prf_round->communicated_bits[vidx], pp->view_size);
  // hash output share
  hash_update(&ctx, prf_round->output_shares[vidx], pp->input_output_size);
  hash_final(&ctx);
  hash_squeeze(&ctx, prf_round->commitments[vidx], hashlen);
  hash_clear(&ctx);
}